

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::Write(RWSocket *this)

{
  uint32_t in_EDX;
  char *in_RSI;
  
  Write((RWSocket *)&this[-1].super_CNSocket,in_RSI,in_EDX);
  return;
}

Assistant:

bool RWSocket::Write(const char* src, uint32_t len) {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    //can't send now
    if (_write_buffer->GetCanReadLength() > 0) {
        if (_write_buffer->GetCanReadLength() > __max_write_cache) {
            return false;
        }
        
        _write_buffer->Write(src, len);
        auto actions = GetEventActions();
        if (actions) {
            return actions->AddSendEvent(_event);
        }
        return false;

    } else {
        _write_buffer->Write(src, len);
        return Send();
    }
}